

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Recorder::AddPoint(ChFunction_Recorder *this,double mx,double my,double mw)

{
  size_t *psVar1;
  double dVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  p_Var5 = (this->m_points).
           super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node
           .super__List_node_base._M_next;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  p_Var4 = (_List_node_base *)&this->m_points;
  do {
    p_Var3 = p_Var4;
    if (p_Var3 == p_Var5) goto LAB_008b4b7b;
    p_Var4 = p_Var3->_M_prev;
    dVar2 = mx - (double)p_Var4[1]._M_next;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar2;
    auVar7 = vandpd_avx(auVar7,auVar6);
    if (auVar7._0_8_ < 2.220446049250313e-16) {
      p_Var4[1]._M_next = (_List_node_base *)mx;
      p_Var4[1]._M_prev = (_List_node_base *)my;
      p_Var4[2]._M_next = (_List_node_base *)mw;
      goto LAB_008b4b76;
    }
  } while (dVar2 <= 0.0);
  p_Var4 = (_List_node_base *)::operator_new(0x28);
  p_Var4[1]._M_next = (_List_node_base *)mx;
  p_Var4[1]._M_prev = (_List_node_base *)my;
  p_Var4[2]._M_next = (_List_node_base *)mw;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->m_points).
            super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_008b4b76:
  if (p_Var3 == p_Var5) {
LAB_008b4b7b:
    p_Var5 = (_List_node_base *)::operator_new(0x28);
    p_Var5[1]._M_next = (_List_node_base *)mx;
    p_Var5[1]._M_prev = (_List_node_base *)my;
    p_Var5[2]._M_next = (_List_node_base *)mw;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->m_points).
              super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void ChFunction_Recorder::AddPoint(double mx, double my, double mw) {
    for (auto iter = m_points.rbegin(); iter != m_points.rend(); ++iter) {
        double dist = mx - iter->x;
        if (std::abs(dist) < std::numeric_limits<double>::epsilon()) {
            // Overwrite current iterator
            iter->x = mx;
            iter->y = my;
            iter->w = mw;
            return;
        } else if (dist > 0) {
            // Insert before current iterator
            ChRecPoint rec(mx, my, mw);
            m_points.insert(iter.base(), rec);
            return;
        }
    }

    // Insert in front of list
    m_points.push_front(ChRecPoint(mx, my, mw));
}